

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

int64_t __thiscall
icu_63::CollationRootElements::firstCEWithPrimaryAtLeast(CollationRootElements *this,uint32_t p)

{
  int local_20;
  uint local_1c;
  int32_t index;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  if (p == 0) {
    this_local = (CollationRootElements *)0x0;
  }
  else {
    local_20 = findP(this,p);
    local_1c = p;
    if (p != (this->elements[local_20] & 0xffffff00)) {
      do {
        local_20 = local_20 + 1;
        local_1c = this->elements[local_20];
      } while ((local_1c & 0x80) != 0);
    }
    this_local = (CollationRootElements *)((ulong)local_1c << 0x20 | 0x5000500);
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
CollationRootElements::firstCEWithPrimaryAtLeast(uint32_t p) const {
    if(p == 0) { return 0; }
    int32_t index = findP(p);
    if(p != (elements[index] & 0xffffff00)) {
        for(;;) {
            p = elements[++index];
            if((p & SEC_TER_DELTA_FLAG) == 0) {
                // First primary after p. We must not be in a primary range.
                U_ASSERT((p & PRIMARY_STEP_MASK) == 0);
                break;
            }
        }
    }
    // The code above guarantees that p has at most 3 bytes: (p & 0xff) == 0.
    return ((int64_t)p << 32) | Collation::COMMON_SEC_AND_TER_CE;
}